

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_attr_int(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  int32_t tmp;
  int32_t isz;
  undefined4 local_18;
  undefined4 local_14;
  
  _local_18 = CONCAT44(4,(int)a);
  eVar1 = (*ctxt->do_write)(ctxt,&local_14,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_18,4,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_attr_int (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    int32_t      tmp = a->i;

    rv = save_attr_sz (ctxt, sizeof (int32_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 1);
    return rv;
}